

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O0

void rhash_free(rhash ctx)

{
  rhash_hash_info *info;
  uint i;
  rhash_context_ext *ectx;
  rhash ctx_local;
  
  if (ctx != (rhash)0x0) {
    if (10 < (uint)ctx[1].msg_size) {
      __assert_fail("ectx->hash_vector_size <= RHASH_HASH_COUNT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibrhash/librhash/rhash.c"
                    ,0xa2,"void rhash_free(rhash)");
    }
    ctx[1].hash_id = 0xdecea5ed;
    for (info._4_4_ = 0; info._4_4_ < (uint)ctx[1].msg_size; info._4_4_ = info._4_4_ + 1) {
      if (*(long *)(*(long *)&ctx[(ulong)info._4_4_ + 3].hash_id + 0x30) != 0) {
        (**(code **)(*(long *)&ctx[(ulong)info._4_4_ + 3].hash_id + 0x30))
                  (ctx[(ulong)info._4_4_ + 4].msg_size);
      }
    }
    free(ctx);
  }
  return;
}

Assistant:

void rhash_free(rhash ctx)
{
	rhash_context_ext* const ectx = (rhash_context_ext*)ctx;
	unsigned i;

	if (ctx == 0) return;
	assert(ectx->hash_vector_size <= RHASH_HASH_COUNT);
	ectx->state = STATE_DELETED; /* mark memory block as being removed */

	/* clean the hash functions, which require additional clean up */
	for (i = 0; i < ectx->hash_vector_size; i++) {
		struct rhash_hash_info* info = ectx->vector[i].hash_info;
		if (info->cleanup != 0) {
			info->cleanup(ectx->vector[i].context);
		}
	}

	free(ectx);
}